

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
parser::Parser::Parser
          (Parser *this,Grammar *grammar,bool debug,TerminalNames *terminalNames,
          NonTerminalNames *nonTerminalNames)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  pointer piVar5;
  reference pvVar6;
  vector<parser::ActionState,_std::allocator<parser::ActionState>_> *pvVar7;
  const_reference pvVar8;
  __normal_iterator<parser::ActionState_*,_std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>
  _Var9;
  State *pSVar10;
  ostream *poVar11;
  size_t j;
  ulong uVar12;
  pointer this_00;
  size_t sVar13;
  State state;
  _Base_ptr __v;
  ulong __n;
  _Base_ptr p_Var14;
  pointer pSVar15;
  CanonicalSet canonicalSet;
  ActionState actionState;
  Situations goToSits;
  UniqueTerminals uniqueTerminals;
  UniqueNonTerminals uniqueNonTerminals;
  UniqueGrammaticSymbols uniqueGrammaticSymbols;
  string local_50;
  
  this->states = 0;
  this->terminals = 0;
  (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->nonTerminals = 0;
  (this->actionTable).
  super__Vector_base<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->actionTable).
  super__Vector_base<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actionTable).
  super__Vector_base<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->debug = debug;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->terminalNames)._M_t,&terminalNames->_M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->nonTerminalNames)._M_t,&nonTerminalNames->_M_t);
  p_Var1 = &uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header;
  uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (grammar->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var4 != &(grammar->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    uniqueTerminals._M_t._M_impl._0_4_ = p_Var4[1]._M_color;
    uniqueTerminals._M_t._M_impl._4_1_ = 0;
    std::
    _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
    ::_M_insert_unique<parser::GrammaticSymbol>
              ((_Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
                *)&uniqueGrammaticSymbols,(GrammaticSymbol *)&uniqueTerminals);
    for (p_Var14 = p_Var4[1]._M_parent; p_Var14 != p_Var4[1]._M_left;
        p_Var14 = (_Base_ptr)&p_Var14->_M_right) {
      for (__v = *(_Base_ptr *)p_Var14; __v != p_Var14->_M_parent; __v = (_Base_ptr)&__v->_M_parent)
      {
        std::
        _Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
        ::_M_insert_unique<parser::GrammaticSymbol_const&>
                  ((_Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
                    *)&uniqueGrammaticSymbols,(GrammaticSymbol *)__v);
      }
    }
  }
  items(&canonicalSet,this,grammar,&uniqueGrammaticSymbols);
  uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_header;
  uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4[1].field_0x4 == '\x01') {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &uniqueTerminals,(int *)(p_Var4 + 1));
    }
  }
  uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header;
  uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = uniqueGrammaticSymbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4[1].field_0x4 == '\0') {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &uniqueNonTerminals,(int *)(p_Var4 + 1));
    }
  }
  sVar13 = (long)canonicalSet.
                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)canonicalSet.
                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5;
  this->states = sVar13;
  this->terminals = uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->nonTerminals = uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>,_std::allocator<std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>_>_>
  ::resize(&this->actionTable,
           sVar13 * uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<int,_std::allocator<int>_>::resize(&this->goToTable,this->nonTerminals * this->states)
  ;
  piVar2 = (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar5 = (this->goToTable).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    *piVar5 = -1;
  }
  for (__n = 0; __n < (ulong)((long)canonicalSet.
                                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)canonicalSet.
                                    super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                       (&canonicalSet,__n);
    pSVar15 = (pvVar6->situations).
              super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
              super__Vector_impl_data._M_start;
    while( true ) {
      pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (&canonicalSet,__n);
      state = (State)__n;
      if (pSVar15 ==
          (pvVar6->situations).
          super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      for (p_Var4 = uniqueTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &uniqueTerminals._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        if ((long)(pSVar15->super_Convolution).body.
                  super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pSVar15->super_Convolution).body.
                  super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 == pSVar15->point) {
          pvVar7 = getAction(this,state,p_Var4[1]._M_color);
          goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl
          .super__Vector_impl_data._M_finish._0_4_ = (pSVar15->super_Convolution).header;
          if ((int)goToSits.
                   super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl
                   .super__Vector_impl_data._M_finish == 0) {
            goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
            _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
            goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
            _M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
            goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          else {
            goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)(pSVar15->super_Convolution).body.
                                 super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pSVar15->super_Convolution).body.
                                 super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
            goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
            _M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
            goToSits.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
            _M_impl.super__Vector_impl_data._M_start._4_4_ = state;
          }
          std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::
          emplace_back<parser::ActionState>(pvVar7,(ActionState *)&goToSits);
        }
        else {
          pvVar8 = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::
                   at(&(pSVar15->super_Convolution).body,pSVar15->point);
          if (pvVar8->isTerminal == true) {
            pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                               (&canonicalSet,__n);
            actionState.action = p_Var4[1]._M_color;
            actionState.state = CONCAT31(actionState.state._1_3_,1);
            goTo(&goToSits,this,grammar,&pvVar6->situations,(GrammaticSymbol *)&actionState);
            for (uVar12 = 0;
                uVar12 < (ulong)((long)canonicalSet.
                                       super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)canonicalSet.
                                       super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar12 = uVar12 + 1) {
              pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::
                       at(&canonicalSet,uVar12);
              bVar3 = std::operator==(&pvVar6->situations,
                                      (vector<parser::Situation,_std::allocator<parser::Situation>_>
                                       *)&goToSits);
              if (bVar3) {
                actionState.action = Shift;
                actionState.state = (State)uVar12;
                actionState.nonTerminal = 0;
                actionState.reduceCount = 0;
                pvVar7 = getAction(this,state,p_Var4[1]._M_color);
                _Var9 = std::
                        __find_if<__gnu_cxx::__normal_iterator<parser::ActionState*,std::vector<parser::ActionState,std::allocator<parser::ActionState>>>,__gnu_cxx::__ops::_Iter_equals_val<parser::ActionState_const>>
                                  ((pvVar7->
                                   super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>
                                   )._M_impl.super__Vector_impl_data._M_start,
                                   (pvVar7->
                                   super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>
                                   )._M_impl.super__Vector_impl_data._M_finish,&actionState);
                if (_Var9._M_current ==
                    (pvVar7->
                    super__Vector_base<parser::ActionState,_std::allocator<parser::ActionState>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<parser::ActionState,_std::allocator<parser::ActionState>_>::push_back
                            (pvVar7,&actionState);
                }
              }
            }
            std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                      ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&goToSits);
          }
        }
      }
      pSVar15 = pSVar15 + 1;
    }
    for (p_Var4 = uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &uniqueNonTerminals._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (&canonicalSet,__n);
      actionState.action = p_Var4[1]._M_color;
      actionState.state = actionState.state & 0xffffff00;
      goTo(&goToSits,this,grammar,&pvVar6->situations,(GrammaticSymbol *)&actionState);
      for (uVar12 = 0;
          uVar12 < (ulong)((long)canonicalSet.
                                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)canonicalSet.
                                 super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar12 = uVar12 + 1) {
        pvVar6 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                           (&canonicalSet,uVar12);
        bVar3 = std::operator==((vector<parser::Situation,_std::allocator<parser::Situation>_> *)
                                &goToSits,&pvVar6->situations);
        if (bVar3) {
          pSVar10 = getGoTo(this,state,p_Var4[1]._M_color);
          *pSVar10 = (State)uVar12;
        }
      }
      std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                ((vector<parser::Situation,_std::allocator<parser::Situation>_> *)&goToSits);
    }
  }
  if (debug) {
    poVar11 = std::operator<<((ostream *)&std::cout,"records in canonical set ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::endl<char,std::char_traits<char>>(poVar11);
    for (this_00 = canonicalSet.
                   super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        canonicalSet.
        super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>._M_impl.
        super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      poVar11 = CanonicalItem::stringify
                          (this_00,(ostream *)&std::cout,terminalNames,nonTerminalNames);
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    poVar11 = dotStringify(this,(ostream *)&std::cout,grammar,&canonicalSet);
    std::endl<char,std::char_traits<char>>(poVar11);
    stringifyTables_abi_cxx11_(&local_50,this);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&uniqueNonTerminals._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&uniqueTerminals._M_t);
  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::~vector(&canonicalSet)
  ;
  std::
  _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  ::~_Rb_tree(&uniqueGrammaticSymbols._M_t);
  return;
}

Assistant:

explicit Parser(Grammar const& grammar = Grammar(),
                        bool debug = false,
                        lexer::TerminalNames const& terminalNames = lexer::TerminalNames(),
                        NonTerminalNames const& nonTerminalNames = NonTerminalNames()) :
                states(0), terminals(0), nonTerminals(0), debug(debug), terminalNames(terminalNames),
                nonTerminalNames(nonTerminalNames) {
            UniqueGrammaticSymbols uniqueGrammaticSymbols;
            for_each_c(Grammar, grammar, rule)
            {
                uniqueGrammaticSymbols.insert(GrammaticSymbol(rule->first, false));
                for_each_c(Alternative, rule->second, variants)
                    for_each_c(GrammaticSymbols, (*variants), item)
                        uniqueGrammaticSymbols.insert(*item);
            }

            CanonicalSet canonicalSet = items(grammar, uniqueGrammaticSymbols);

            UniqueTerminals uniqueTerminals;
            for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol)
                if (symbol->isTerminal)
                    uniqueTerminals.insert(symbol->value);
            UniqueNonTerminals uniqueNonTerminals;
            for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol)
                if (!symbol->isTerminal)
                    uniqueNonTerminals.insert(symbol->value);

            states = canonicalSet.size();
            terminals = uniqueTerminals.size();
            nonTerminals = uniqueNonTerminals.size();

            actionTable.resize(states * terminals);
            goToTable.resize(states * nonTerminals);
            for_each(StateTable, goToTable, gt) *gt = -1;

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                for_each_c(Situations, canonicalSet.at(i).situations, situation) {
                    for_each(UniqueTerminals, uniqueTerminals, terminal) {
                        if (situation->body.size() == situation->point) {
                            getAction(i, *terminal).push_back(
                                    situation->header == StartNonTerminal ? ActionState(Accept, 0, 0, 0)
                                                                          : ActionState(Reduce, i, situation->header, situation->body.size()));
                        } else {
                            if (!situation->body.at(situation->point).isTerminal)
                                continue;

                            Situations goToSits = goTo(grammar, canonicalSet.at(i).situations, GrammaticSymbol(*terminal));

                            for (size_t j = 0; j < canonicalSet.size(); ++j) {
                                if (canonicalSet.at(j).situations == goToSits) {
                                    ActionState actionState(Shift, j, 0, 0);
                                    std::vector<ActionState>& actions = getAction(i, *terminal);
                                    if (std::find(actions.begin(), actions.end(), actionState) == actions.end()) {
                                        actions.push_back(actionState);
                                    }
                                }
                            }
                        }
                    }
                }
                for_each(UniqueNonTerminals, uniqueNonTerminals, nonTerminal) {
                    Situations gts = goTo(grammar, canonicalSet.at(i).situations, GrammaticSymbol(*nonTerminal, false));
                    for (State j = 0; j < canonicalSet.size(); ++j) {
                        if (gts == canonicalSet.at(j).situations) {
                            getGoTo(i, *nonTerminal) = j;
                        }
                    }
                }
            }

            if (debug) {
                std::cout << "records in canonical set " << canonicalSet.size() << std::endl;
                for_each(CanonicalSet, canonicalSet, item)
                    item->stringify(std::cout, terminalNames, nonTerminalNames) << std::endl;
                dotStringify(std::cout, grammar, canonicalSet) << std::endl;
                stringifyTables();
            }
        }